

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>::templated_iterator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,std::tuple<slang::DiagCode,slang::SourceLocation>,slang::Hasher<std::tuple<slang::DiagCode,slang::SourceLocation>>,ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,slang::SourceLocation>,std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,slang::Hasher<std::tuple<slang::DiagCode,slang::SourceLocation>>>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,slang::SourceLocation>,std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>>
::
emplace<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>
          (sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,std::tuple<slang::DiagCode,slang::SourceLocation>,slang::Hasher<std::tuple<slang::DiagCode,slang::SourceLocation>>,ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,slang::SourceLocation>,std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,slang::Hasher<std::tuple<slang::DiagCode,slang::SourceLocation>>>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,slang::SourceLocation>,std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>>
           *this,pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                 *key)

{
  bool bVar1;
  size_t sVar2;
  char distance_from_desired;
  EntryPointer current_entry;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>::templated_iterator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_bool>
  pVar3;
  
  sVar2 = slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>::operator()
                    ((Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_> *)this,&key->first
                    );
  current_entry =
       (EntryPointer)
       ((sVar2 * -0x61c8864680b583eb >> ((byte)this[0x10] & 0x3f)) * 0x30 + *(long *)this);
  distance_from_desired = '\0';
  while( true ) {
    if (current_entry->distance_from_desired < distance_from_desired) {
      pVar3 = emplace_new_key<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>
                        (this,distance_from_desired,current_entry,key);
      return pVar3;
    }
    bVar1 = std::
            __tuple_compare<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_0UL,_2UL>
            ::__eq(&key->first,&(current_entry->field_1).value.first);
    if (bVar1) break;
    current_entry = current_entry + 1;
    distance_from_desired = distance_from_desired + '\x01';
  }
  pVar3._8_8_ = 0;
  pVar3.first.current = current_entry;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }